

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O1

QSupportedWritingSystems __thiscall
QPlatformFontDatabase::writingSystemsFromOS2Table
          (QPlatformFontDatabase *this,char *os2Table,size_t length)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  long in_FS_OFFSET;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  quint32 codePageRange [2];
  uint local_30;
  uint uStack_2c;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (length < 0x56) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QSupportedWritingSystems::QSupportedWritingSystems((QSupportedWritingSystems *)this);
      return (QSupportedWritingSystems)(QWritingSystemsPrivate *)this;
    }
  }
  else {
    auVar28 = *(undefined1 (*) [16])(os2Table + 0x2a);
    auVar30[1] = 0;
    auVar30[0] = auVar28[8];
    auVar30[2] = auVar28[9];
    auVar30[3] = 0;
    auVar30[4] = auVar28[10];
    auVar30[5] = 0;
    auVar30[6] = auVar28[0xb];
    auVar30[7] = 0;
    auVar30[8] = auVar28[0xc];
    auVar30[9] = 0;
    auVar30[10] = auVar28[0xd];
    auVar30[0xb] = 0;
    auVar30[0xc] = auVar28[0xe];
    auVar30[0xd] = 0;
    auVar30[0xe] = auVar28[0xf];
    auVar30[0xf] = 0;
    auVar29 = pshuflw(auVar30,auVar30,0x1b);
    auVar30 = pshufhw(auVar29,auVar29,0x1b);
    auVar19[0xd] = 0;
    auVar19._0_13_ = auVar28._0_13_;
    auVar19[0xe] = auVar28[7];
    auVar20[0xc] = auVar28[6];
    auVar20._0_12_ = auVar28._0_12_;
    auVar20._13_2_ = auVar19._13_2_;
    auVar21[0xb] = 0;
    auVar21._0_11_ = auVar28._0_11_;
    auVar21._12_3_ = auVar20._12_3_;
    auVar22[10] = auVar28[5];
    auVar22._0_10_ = auVar28._0_10_;
    auVar22._11_4_ = auVar21._11_4_;
    auVar23[9] = 0;
    auVar23._0_9_ = auVar28._0_9_;
    auVar23._10_5_ = auVar22._10_5_;
    auVar24[8] = auVar28[4];
    auVar24._0_8_ = auVar28._0_8_;
    auVar24._9_6_ = auVar23._9_6_;
    auVar25._7_8_ = 0;
    auVar25._0_7_ = auVar24._8_7_;
    auVar26._1_8_ = SUB158(auVar25 << 0x40,7);
    auVar26[0] = auVar28[3];
    auVar26._9_6_ = 0;
    auVar27._1_10_ = SUB1510(auVar26 << 0x30,5);
    auVar27[0] = auVar28[2];
    auVar27._11_4_ = 0;
    auVar29._3_12_ = SUB1512(auVar27 << 0x20,3);
    auVar29[2] = auVar28[1];
    auVar29[0] = auVar28[0];
    auVar29[1] = 0;
    auVar29[0xf] = 0;
    auVar28 = pshuflw(auVar29,auVar29,0x1b);
    auVar28 = pshufhw(auVar28,auVar28,0x1b);
    sVar3 = auVar28._0_2_;
    sVar4 = auVar28._2_2_;
    sVar5 = auVar28._4_2_;
    sVar6 = auVar28._6_2_;
    sVar7 = auVar28._8_2_;
    sVar8 = auVar28._10_2_;
    sVar9 = auVar28._12_2_;
    sVar10 = auVar28._14_2_;
    sVar11 = auVar30._0_2_;
    sVar12 = auVar30._2_2_;
    sVar13 = auVar30._4_2_;
    sVar14 = auVar30._6_2_;
    sVar15 = auVar30._8_2_;
    sVar16 = auVar30._10_2_;
    sVar17 = auVar30._12_2_;
    sVar18 = auVar30._14_2_;
    _local_28 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar28[0xe] - (0xff < sVar10),
                         CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar28[0xc] - (0xff < sVar9),
                                  CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar28[10] -
                                           (0xff < sVar8),
                                           CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar28[8] -
                                                    (0xff < sVar7),
                                                    CONCAT13((0 < sVar6) * (sVar6 < 0x100) *
                                                             auVar28[6] - (0xff < sVar6),
                                                             CONCAT12((0 < sVar5) * (sVar5 < 0x100)
                                                                      * auVar28[4] - (0xff < sVar5),
                                                                      CONCAT11((0 < sVar4) *
                                                                               (sVar4 < 0x100) *
                                                                               auVar28[2] -
                                                                               (0xff < sVar4),
                                                                               (0 < sVar3) *
                                                                               (sVar3 < 0x100) *
                                                                               auVar28[0] -
                                                                               (0xff < sVar3))))))))
    ;
    _cStack_20 = CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar30[0xe] - (0xff < sVar18),
                          CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar30[0xc] - (0xff < sVar17),
                                   CONCAT15((0 < sVar16) * (sVar16 < 0x100) * auVar30[10] -
                                            (0xff < sVar16),
                                            CONCAT14((0 < sVar15) * (sVar15 < 0x100) * auVar30[8] -
                                                     (0xff < sVar15),
                                                     CONCAT13((0 < sVar14) * (sVar14 < 0x100) *
                                                              auVar30[6] - (0xff < sVar14),
                                                              CONCAT12((0 < sVar13) *
                                                                       (sVar13 < 0x100) * auVar30[4]
                                                                       - (0xff < sVar13),
                                                                       CONCAT11((0 < sVar12) *
                                                                                (sVar12 < 0x100) *
                                                                                auVar30[2] -
                                                                                (0xff < sVar12),
                                                                                (0 < sVar11) *
                                                                                (sVar11 < 0x100) *
                                                                                auVar30[0] -
                                                                                (0xff < sVar11))))))
                                  ));
    uVar1 = *(uint *)(os2Table + 0x4e);
    uVar2 = *(uint *)(os2Table + 0x52);
    _local_30 = CONCAT44(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                         uVar2 << 0x18,
                         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                         uVar1 << 0x18);
    writingSystemsFromTrueTypeBits(this,(quint32 *)&local_28,&local_30);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return (QSupportedWritingSystems)(QWritingSystemsPrivate *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QSupportedWritingSystems QPlatformFontDatabase::writingSystemsFromOS2Table(const char *os2Table, size_t length)
{
    if (length >= 86)  {
        quint32 unicodeRange[4] = {
            qFromBigEndian<quint32>(os2Table + 42),
            qFromBigEndian<quint32>(os2Table + 46),
            qFromBigEndian<quint32>(os2Table + 50),
            qFromBigEndian<quint32>(os2Table + 54)
        };
        quint32 codePageRange[2] = {
            qFromBigEndian<quint32>(os2Table + 78),
            qFromBigEndian<quint32>(os2Table + 82)
        };

        return writingSystemsFromTrueTypeBits(unicodeRange, codePageRange);
    }

    return QSupportedWritingSystems();
}